

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void kratos::mock_hierarchy(Generator *top,string *top_name)

{
  _Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  *this;
  Context *this_00;
  long lVar1;
  Generator *this_01;
  InternalException *this_02;
  uint uVar2;
  __shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *this_03;
  bool bVar3;
  undefined1 local_c8 [8];
  string name;
  string instance_name;
  long local_70;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = top_name;
  std::__cxx11::string::string
            ((string *)(&name.field_2._M_allocated_capacity + 1),(string *)&top->instance_name);
  lVar1 = std::__cxx11::string::find((char)(string *)(&name.field_2._M_allocated_capacity + 1),0x2e)
  ;
  if (lVar1 != -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(instance_name.field_2._M_local_buf + 8),".",(allocator<char> *)local_c8);
    string::get_tokens((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_58,(string *)((long)&name.field_2 + 8),
                       (string *)((long)&instance_name.field_2 + 8));
    std::__cxx11::string::~string((string *)(instance_name.field_2._M_local_buf + 8));
    if ((ulong)((long)names.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)local_58) < 0x21) {
      this_02 = (InternalException *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&instance_name.field_2 + 8),"Cannot tokenize string ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&name.field_2 + 8));
      InternalException::InternalException(this_02,(string *)((long)&instance_name.field_2 + 8));
      __cxa_throw(this_02,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = top->context_;
    std::__cxx11::string::_M_assign((string *)&top->instance_name);
    uVar2 = (int)((ulong)((long)names.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start - (long)local_58) >> 5) -
            2;
    while (-1 < (int)uVar2) {
      std::__cxx11::string::string
                ((string *)local_c8,(string *)((long)local_58 + (ulong)uVar2 * 0x20));
      bVar3 = uVar2 == 0;
      uVar2 = uVar2 - 1;
      if ((bVar3) &&
         ((names.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_string_length != 0)) {
        std::__cxx11::string::_M_assign((string *)local_c8);
      }
      bVar3 = Context::generator_name_exists(this_00,(string *)local_c8);
      if (bVar3) {
        this = (_Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                *)((long)&instance_name.field_2 + 8);
        Context::get_generators_by_name
                  ((set<std::shared_ptr<kratos::Generator>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                    *)this,this_00,(string *)local_c8);
        this_01 = *(Generator **)(local_70 + 0x20);
        std::
        _Rb_tree<std::shared_ptr<kratos::Generator>,_std::shared_ptr<kratos::Generator>,_std::_Identity<std::shared_ptr<kratos::Generator>_>,_std::less<std::shared_ptr<kratos::Generator>_>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
        ::~_Rb_tree(this);
      }
      else {
        this_01 = Context::generator(this_00,(string *)local_c8);
      }
      this_03 = (__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)
                ((long)&instance_name.field_2 + 8);
      std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<kratos::Generator,void>
                (this_03,(__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
                         &top->super_enable_shared_from_this<kratos::Generator>);
      Generator::add_child_generator
                (this_01,&top->instance_name,(shared_ptr<kratos::Generator> *)this_03);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff80);
      std::__cxx11::string::~string((string *)local_c8);
      top = this_01;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_58);
  }
  std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
  return;
}

Assistant:

void mock_hierarchy(Generator *top, const std::string &top_name) {
    // can only perform on the top layer
    auto instance_name = top->instance_name;
    if (instance_name.find('.') == std::string::npos) {
        return;
    }
    // need to tokenize based on the instance names
    auto names = string::get_tokens(instance_name, ".");
    if (names.size() < 2) throw InternalException("Cannot tokenize string " + instance_name);
    Context *context = top->context();
    top->instance_name = names.back();
    int start_index = static_cast<int>(names.size() - 2);
    Generator *pre = top;
    for (int i = start_index; i >= 0; i--) {
        // create a new generator
        std::string name = names[i];
        if (i == 0 && !top_name.empty()) name = top_name;
        Generator *gen;
        if (context->generator_name_exists(name)) {
            gen = (*(context->get_generators_by_name(name).begin())).get();
        } else {
            gen = &context->generator(name);
        }
        gen->add_child_generator(pre->instance_name, pre->shared_from_this());
        pre = gen;
    }
}